

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

string * __thiscall
google::anon_unknown_1::CommandLineFlagParser::ProcessOptionsFromStringLocked
          (string *__return_storage_ptr__,CommandLineFlagParser *this,string *contentdata,
          FlagSettingMode set_mode)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  CommandLineFlag *flag;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  _Alloc_hider _Var9;
  string key;
  char *value;
  string error_message;
  string line;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pcVar5 = (contentdata->_M_dataplus)._M_p;
  bVar1 = true;
  bVar3 = false;
  pcVar8 = pcVar5;
  do {
    pcVar6 = pcVar8;
    if (pcVar5 == (char *)0x0) {
      return __return_storage_ptr__;
    }
    while ((*pcVar6 != '\0' && (iVar4 = isspace((int)*pcVar6), iVar4 != 0))) {
      pcVar8 = pcVar8 + 1;
      pcVar6 = pcVar6 + 1;
    }
    pcVar5 = strchr(pcVar6,10);
    if (pcVar5 == (char *)0x0) {
      sVar7 = strlen(pcVar6);
    }
    else {
      sVar7 = (long)pcVar5 - (long)pcVar8;
    }
    line._M_dataplus._M_p = (pointer)&line.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&line,pcVar6,pcVar6 + sVar7);
    if ((line._M_string_length != 0) && (cVar2 = *line._M_dataplus._M_p, cVar2 != '#')) {
      if (cVar2 == '-') {
        if (bVar1) {
          pcVar8 = line._M_dataplus._M_p + 1;
          if (line._M_dataplus._M_p[1] == '-') {
            pcVar8 = line._M_dataplus._M_p + 2;
          }
          key._M_dataplus._M_p = (pointer)&key.field_2;
          key._M_string_length = 0;
          error_message._M_dataplus._M_p = (pointer)&error_message.field_2;
          error_message._M_string_length = 0;
          key.field_2._M_local_buf[0] = '\0';
          error_message.field_2._M_local_buf[0] = '\0';
          flag = FlagRegistry::SplitArgumentLocked
                           (this->registry_,pcVar8,&key,&value,&error_message);
          if (value != (char *)0x0 && flag != (CommandLineFlag *)0x0) {
            (anonymous_namespace)::CommandLineFlagParser::ProcessSingleOptionLocked_abi_cxx11_
                      (&local_50,this,flag,value,set_mode);
            std::__cxx11::string::append((string *)__return_storage_ptr__);
            std::__cxx11::string::~string((string *)&local_50);
          }
          std::__cxx11::string::~string((string *)&error_message);
          std::__cxx11::string::~string((string *)&key);
        }
        bVar3 = false;
      }
      else {
        _Var9._M_p = line._M_dataplus._M_p;
        if (!bVar3) {
          bVar1 = false;
        }
        while ((bVar3 = true, cVar2 != '\0' && (!bVar1))) {
          pcVar8 = strchr(_Var9._M_p,0x20);
          if (pcVar8 == (char *)0x0) {
            sVar7 = strlen(_Var9._M_p);
            pcVar8 = _Var9._M_p + sVar7;
          }
          key._M_dataplus._M_p = (pointer)&key.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&key,_Var9._M_p,pcVar8);
          bVar3 = std::operator==(&key,argv0_abi_cxx11_);
          if (bVar3) {
LAB_001918c0:
            bVar1 = true;
          }
          else {
            pcVar6 = ProgramInvocationShortName();
            bVar3 = std::operator==(&key,pcVar6);
            if ((bVar3) ||
               (iVar4 = fnmatch(key._M_dataplus._M_p,argv0_abi_cxx11_,1), _Var9 = key._M_dataplus,
               iVar4 == 0)) goto LAB_001918c0;
            pcVar6 = ProgramInvocationShortName();
            iVar4 = fnmatch(_Var9._M_p,pcVar6,1);
            if (iVar4 == 0) goto LAB_001918c0;
          }
          std::__cxx11::string::~string((string *)&key);
          cVar2 = *pcVar8;
          _Var9._M_p = pcVar8 + 1;
        }
      }
    }
    std::__cxx11::string::~string((string *)&line);
    pcVar8 = pcVar5 + 1;
  } while( true );
}

Assistant:

string CommandLineFlagParser::ProcessOptionsFromStringLocked(
    const string& contentdata, FlagSettingMode set_mode) {
  string retval;
  const char* flagfile_contents = contentdata.c_str();
  bool flags_are_relevant = true;   // set to false when filenames don't match
  bool in_filename_section = false;

  const char* line_end = flagfile_contents;
  // We read this file a line at a time.
  for (; line_end; flagfile_contents = line_end + 1) {
    while (*flagfile_contents && isspace(*flagfile_contents))
      ++flagfile_contents;
    line_end = strchr(flagfile_contents, '\n');
    size_t len = line_end ? line_end - flagfile_contents
                          : strlen(flagfile_contents);
    string line(flagfile_contents, len);

    // Each line can be one of four things:
    // 1) A comment line -- we skip it
    // 2) An empty line -- we skip it
    // 3) A list of filenames -- starts a new filenames+flags section
    // 4) A --flag=value line -- apply if previous filenames match
    if (line.empty() || line[0] == '#') {
      // comment or empty line; just ignore

    } else if (line[0] == '-') {    // flag
      in_filename_section = false;  // instead, it was a flag-line
      if (!flags_are_relevant)      // skip this flag; applies to someone else
        continue;

      const char* name_and_val = line.c_str() + 1;    // skip the leading -
      if (*name_and_val == '-')
        name_and_val++;                               // skip second - too
      string key;
      const char* value;
      string error_message;
      CommandLineFlag* flag = registry_->SplitArgumentLocked(name_and_val,
                                                             &key, &value,
                                                             &error_message);
      // By API, errors parsing flagfile lines are silently ignored.
      if (flag == NULL) {
        // "WARNING: flagname '" + key + "' not found\n"
      } else if (value == NULL) {
        // "WARNING: flagname '" + key + "' missing a value\n"
      } else {
        retval += ProcessSingleOptionLocked(flag, value, set_mode);
      }

    } else {                        // a filename!
      if (!in_filename_section) {   // start over: assume filenames don't match
        in_filename_section = true;
        flags_are_relevant = false;
      }

      // Split the line up at spaces into glob-patterns
      const char* space = line.c_str();   // just has to be non-NULL
      for (const char* word = line.c_str(); *space; word = space+1) {
        if (flags_are_relevant)     // we can stop as soon as we match
          break;
        space = strchr(word, ' ');
        if (space == NULL)
          space = word + strlen(word);
        const string glob(word, space - word);
        // We try matching both against the full argv0 and basename(argv0)
        if (glob == ProgramInvocationName()       // small optimization
            || glob == ProgramInvocationShortName()
#if defined(HAVE_FNMATCH_H)
            || fnmatch(glob.c_str(), ProgramInvocationName(),      FNM_PATHNAME) == 0
            || fnmatch(glob.c_str(), ProgramInvocationShortName(), FNM_PATHNAME) == 0
#elif defined(HAVE_SHLWAPI_H)
            || PathMatchSpec(glob.c_str(), ProgramInvocationName())
            || PathMatchSpec(glob.c_str(), ProgramInvocationShortName())
#endif
            ) {
          flags_are_relevant = true;
        }
      }
    }
  }
  return retval;
}